

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

ostream * soplex::operator<<(ostream *os,
                            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *v)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  char *pcVar4;
  int __c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  ostream *in_RDI;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff08;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff10;
  ostream *in_stack_ffffffffffffff18;
  undefined1 local_cc [100];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  uint local_44;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  bVar1 = false;
  for (local_44 = 0;
      iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(in_RSI), (int)local_44 < iVar3; local_44 = local_44 + 1) {
    if (bVar1) {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value(in_RSI,local_44);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10);
      if (tVar2) {
        std::operator<<(in_RDI," - ");
        local_28 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::value(in_RSI,local_44);
        local_20 = local_cc;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_29,local_28);
        local_10 = local_cc;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        local_8 = local_cc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  (in_stack_ffffffffffffff10);
        boost::multiprecision::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        std::operator<<(in_RDI," + ");
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::value(in_RSI,local_44);
        boost::multiprecision::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    else {
      in_stack_ffffffffffffff18 = in_RDI;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value(in_RSI,local_44);
      boost::multiprecision::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    in_stack_ffffffffffffff10 = (cpp_dec_float<200U,_int,_void> *)std::operator<<(in_RDI," x");
    pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(in_RSI,(char *)(ulong)local_44,__c);
    std::ostream::operator<<(in_stack_ffffffffffffff10,(int)pcVar4);
    bVar1 = true;
    if ((int)(local_44 + 1) % 4 == 0) {
      std::operator<<(in_RDI,"\n\t");
    }
  }
  return in_RDI;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}